

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
          (RandomViewport *this,RenderTarget *renderTarget,int preferredWidth,int preferredHeight,
          deUint32 seed)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  Random rnd;
  deRandom local_30;
  
  this->x = 0;
  this->y = 0;
  iVar2 = renderTarget->m_width;
  if (preferredWidth < renderTarget->m_width) {
    iVar2 = preferredWidth;
  }
  this->width = iVar2;
  iVar2 = renderTarget->m_height;
  if (preferredHeight < renderTarget->m_height) {
    iVar2 = preferredHeight;
  }
  this->height = iVar2;
  deRandom_init(&local_30,seed);
  iVar2 = renderTarget->m_width;
  iVar1 = this->width;
  dVar3 = deRandom_getUint32(&local_30);
  this->x = dVar3 % ((iVar2 - iVar1) + 1U);
  iVar2 = renderTarget->m_height;
  iVar1 = this->height;
  dVar3 = deRandom_getUint32(&local_30);
  this->y = dVar3 % ((iVar2 - iVar1) + 1U);
  return;
}

Assistant:

RandomViewport::RandomViewport (const tcu::RenderTarget& renderTarget, int preferredWidth, int preferredHeight, deUint32 seed)
	: x			(0)
	, y			(0)
	, width		(deMin32(preferredWidth, renderTarget.getWidth()))
	, height	(deMin32(preferredHeight, renderTarget.getHeight()))
{
	de::Random rnd(seed);
	x = rnd.getInt(0, renderTarget.getWidth()	- width);
	y = rnd.getInt(0, renderTarget.getHeight()	- height);
}